

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O0

vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
* __thiscall
Portioner::get_bucket_cluster
          (vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
           *__return_storage_ptr__,Portioner *this,Point_d *point_in_bucket)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  bool bVar5;
  bool bVar6;
  int local_6c;
  int local_68;
  int j_1;
  int i_1;
  int local_54;
  int local_50;
  int j;
  int i;
  int till_y;
  int from_y;
  int till_x;
  int from_x;
  bool right;
  bool left;
  bool bottom;
  bool top;
  int bucket_row;
  int bucket_collumn;
  long minusvalue;
  Point_d *point_in_bucket_local;
  Portioner *this_local;
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  *point_cluster;
  
  std::
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  ::vector(__return_storage_ptr__);
  iVar1 = (int)(point_in_bucket->x - (double)(long)((int)point_in_bucket->x % this->_X_Bucketsize))
          / this->_X_Bucketsize;
  iVar2 = (int)(point_in_bucket->y - (double)(long)((int)point_in_bucket->y % this->_Y_Bucketsize))
          / this->_Y_Bucketsize;
  if (iVar1 != 0) {
    from_y = iVar1 + -1;
  }
  else {
    from_y = 0;
  }
  bVar5 = iVar1 != this->_width / this->_X_Bucketsize + -1;
  till_y = iVar1;
  if (bVar5) {
    till_y = iVar1 + 1;
  }
  if (iVar2 != 0) {
    i = iVar2 + -1;
  }
  else {
    i = 0;
  }
  bVar6 = iVar2 != this->_height / this->_Y_Bucketsize + -1;
  j = iVar2;
  if (bVar6) {
    j = iVar2 + 1;
  }
  if ((((iVar2 != 0) && (bVar6)) && (iVar1 != 0)) && (bVar5)) {
    for (local_50 = iVar1 + -1; local_50 <= iVar1 + 1; local_50 = local_50 + 1) {
      for (local_54 = iVar2 + -1; local_54 <= iVar2 + 1; local_54 = local_54 + 1) {
        pvVar3 = std::
                 vector<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                 ::operator[](&this->_point_buckets_fast,(long)local_50);
        pvVar4 = std::
                 vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                 ::operator[](pvVar3,(long)local_54);
        std::
        vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
        ::push_back(__return_storage_ptr__,pvVar4);
      }
    }
  }
  else {
    for (local_68 = from_y; local_68 <= till_y; local_68 = local_68 + 1) {
      for (local_6c = i; local_6c <= j; local_6c = local_6c + 1) {
        pvVar3 = std::
                 vector<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>,_std::allocator<std::vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>_>_>
                 ::operator[](&this->_point_buckets_fast,(long)local_68);
        pvVar4 = std::
                 vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                 ::operator[](pvVar3,(long)local_6c);
        std::
        vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
        ::push_back(__return_storage_ptr__,pvVar4);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Point_d>>Portioner::get_bucket_cluster(Point_d const& point_in_bucket)
{
  std::vector<std::vector<Point_d>>point_cluster;

  long minusvalue = ((int)point_in_bucket.x%_X_Bucketsize);
  int bucket_collumn = (int)(point_in_bucket.x-minusvalue)/_X_Bucketsize;
/*
DEBUG
  std::cout<<"bucket column "<< bucket_collumn<<"\n";
  if (bucket_collumn > max_bucket_collumn){
    max_bucket_collumn = bucket_collumn;
  }
*/
  minusvalue = (int)point_in_bucket.y%_Y_Bucketsize;
  int bucket_row = (int)(point_in_bucket.y-minusvalue)/_Y_Bucketsize;

  bool  top = false;
  bool  bottom = false;
  bool  left = false;
  bool  right = false;

  int from_x, till_x, from_y, till_y;


  if(bucket_collumn == 0) {
    left = true;
    from_x = bucket_collumn;
  }
  else{
    from_x = bucket_collumn-1;
  }
  if(bucket_collumn == (_width/_X_Bucketsize-1)) {
    right = true;
    till_x = bucket_collumn;
  }
  else{
    till_x = bucket_collumn+1;
  }
  if(bucket_row == 0) {
    top = true;
    from_y = bucket_row;
  }
  else{
    from_y = bucket_row-1;
  }
  if(bucket_row == (_height/_Y_Bucketsize-1)) {
    bottom = true;
    till_y = bucket_row;

  }
  else{
    till_y = bucket_row+1;
  }
  //if point is in a bucket which is not on border of buckets
  if(top==false && bottom==false && left==false && right==false){
      for(int i = bucket_collumn-1; i<=bucket_collumn+1; i++){
        for(int j = bucket_row-1; j<= bucket_row+1; j++){
          point_cluster.push_back(_point_buckets_fast[i][j]);
        }
      }
    }

  else{ for(int i = from_x; i<=till_x; i++){
          for(int j = from_y; j<= till_y; j++){
            point_cluster.push_back(_point_buckets_fast[i][j]);
          }
        }
      }

  return point_cluster;
}